

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O0

int asn1_ex_i2c(ASN1_VALUE **pval,uchar *cout,int *out_omit,int *putype,ASN1_ITEM *it)

{
  ASN1_VALUE *pAVar1;
  bool bVar2;
  int local_b4;
  int **local_b0;
  int local_9c;
  int **local_98;
  int ret_1;
  int ret;
  ASN1_TYPE *typ;
  int len;
  uchar c;
  uchar *cont;
  long lStack_50;
  int utype;
  ASN1_OBJECT *otmp;
  ASN1_STRING *strtmp;
  ASN1_BOOLEAN *tbool;
  ASN1_ITEM *it_local;
  int *putype_local;
  int *out_omit_local;
  uchar *cout_local;
  ASN1_VALUE **pval_local;
  
  strtmp = (ASN1_STRING *)0x0;
  bVar2 = true;
  if (it->itype != '\0') {
    bVar2 = it->itype == '\x05';
  }
  tbool = (ASN1_BOOLEAN *)it;
  it_local = (ASN1_ITEM *)putype;
  putype_local = out_omit;
  out_omit_local = (int *)cout;
  cout_local = (uchar *)pval;
  if (!bVar2) {
    __assert_fail("it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x212,
                  "int asn1_ex_i2c(ASN1_VALUE **, unsigned char *, int *, int *, const ASN1_ITEM *)"
                 );
  }
  if (it->funcs != (void *)0x0) {
    __assert_fail("it->funcs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x215,
                  "int asn1_ex_i2c(ASN1_VALUE **, unsigned char *, int *, int *, const ASN1_ITEM *)"
                 );
  }
  *out_omit = 0;
  if (((it->itype != '\0') || (it->utype != 1)) && (*pval == (ASN1_VALUE *)0x0)) {
    *out_omit = 1;
    return 0;
  }
  if ((it->itype == '\x05') || (it->utype == -5)) {
    otmp = (ASN1_OBJECT *)*pval;
    cont._4_4_ = *(int *)((long)&otmp->sn + 4);
    if ((cont._4_4_ < 0) && (cont._4_4_ != -3)) {
      ERR_put_error(0xc,0,0xbf,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                    ,0x228);
      return -1;
    }
    if (cont._4_4_ == 0x102) {
      cont._4_4_ = 2;
    }
    else if (cont._4_4_ == 0x10a) {
      cont._4_4_ = 10;
    }
    *putype = cont._4_4_;
  }
  else if (it->utype == -4) {
    pAVar1 = *pval;
    cont._4_4_ = *(int *)pAVar1;
    if ((cont._4_4_ < 0) && (cont._4_4_ != -3)) {
      ERR_put_error(0xc,0,0xbf,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                    ,0x23a);
      return -1;
    }
    *putype = cont._4_4_;
    cout_local = (uchar *)(pAVar1 + 8);
  }
  else {
    cont._4_4_ = *putype;
  }
  switch(cont._4_4_) {
  case 1:
    strtmp = (ASN1_STRING *)cout_local;
    if (*(int *)cout_local == -1) {
      *out_omit = 1;
      return 0;
    }
    if ((it->utype != -4) &&
       (((*(int *)cout_local != 0 && (0 < it->size)) ||
        ((*(int *)cout_local == 0 && (it->size == 0)))))) {
      *out_omit = 1;
      return 0;
    }
    typ._7_1_ = 0;
    if (*(int *)cout_local != 0) {
      typ._7_1_ = 0xff;
    }
    _len = (char *)((long)&typ + 7);
    typ._0_4_ = 1;
    break;
  case 2:
  case 10:
    if (cout == (uchar *)0x0) {
      local_b0 = (int **)0x0;
    }
    else {
      local_b0 = &out_omit_local;
    }
    local_b4 = i2c_ASN1_INTEGER(*(ASN1_INTEGER **)cout_local,(uchar **)local_b0);
    if (local_b4 < 1) {
      local_b4 = -1;
    }
    return local_b4;
  case 3:
    if (cout == (uchar *)0x0) {
      local_98 = (int **)0x0;
    }
    else {
      local_98 = &out_omit_local;
    }
    local_9c = i2c_ASN1_BIT_STRING(*(ASN1_BIT_STRING **)cout_local,(uchar **)local_98);
    if (local_9c < 1) {
      local_9c = -1;
    }
    return local_9c;
  case 5:
    _len = (char *)0x0;
    typ._0_4_ = 0;
    break;
  case 6:
    lStack_50 = *(long *)cout_local;
    _len = *(char **)(lStack_50 + 0x18);
    typ._0_4_ = *(int *)(lStack_50 + 0x14);
    if ((int)typ == 0) {
      ERR_put_error(0xc,0,0x86,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                    ,0x24a);
      return -1;
    }
    break;
  case -3:
  case 4:
  case 0xc:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1e:
    otmp = *(ASN1_OBJECT **)cout_local;
    _len = otmp->ln;
    typ._0_4_ = *(int *)&otmp->sn;
    break;
  default:
    ERR_put_error(0xc,0,0xc1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x28e);
    return -1;
  }
  if ((cout != (uchar *)0x0) && ((int)typ != 0)) {
    OPENSSL_memcpy(cout,_len,(long)(int)typ);
  }
  return (int)typ;
}

Assistant:

static int asn1_ex_i2c(ASN1_VALUE **pval, unsigned char *cout, int *out_omit,
                       int *putype, const ASN1_ITEM *it) {
  ASN1_BOOLEAN *tbool = NULL;
  ASN1_STRING *strtmp;
  ASN1_OBJECT *otmp;
  int utype;
  const unsigned char *cont;
  unsigned char c;
  int len;

  assert(it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING);
  // Historically, |it->funcs| for primitive types contained an
  // |ASN1_PRIMITIVE_FUNCS| table of callbacks.
  assert(it->funcs == NULL);

  *out_omit = 0;

  // Handle omitted optional values for all but BOOLEAN, which uses a
  // non-pointer representation.
  if (it->itype != ASN1_ITYPE_PRIMITIVE || it->utype != V_ASN1_BOOLEAN) {
    if (!*pval) {
      *out_omit = 1;
      return 0;
    }
  }

  if (it->itype == ASN1_ITYPE_MSTRING || it->utype == V_ASN1_ANY_AS_STRING) {
    // If MSTRING type set the underlying type
    strtmp = (ASN1_STRING *)*pval;
    utype = strtmp->type;
    if (utype < 0 && utype != V_ASN1_OTHER) {
      // MSTRINGs can have type -1 when default-constructed.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
      return -1;
    }
    // Negative INTEGER and ENUMERATED values use |ASN1_STRING| type values that
    // do not match their corresponding utype values.
    if (utype == V_ASN1_NEG_INTEGER) {
      utype = V_ASN1_INTEGER;
    } else if (utype == V_ASN1_NEG_ENUMERATED) {
      utype = V_ASN1_ENUMERATED;
    }
    *putype = utype;
  } else if (it->utype == V_ASN1_ANY) {
    // If ANY set type and pointer to value
    ASN1_TYPE *typ;
    typ = (ASN1_TYPE *)*pval;
    utype = typ->type;
    if (utype < 0 && utype != V_ASN1_OTHER) {
      // |ASN1_TYPE|s can have type -1 when default-constructed.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
      return -1;
    }
    *putype = utype;
    pval = &typ->value.asn1_value;
  } else {
    utype = *putype;
  }

  switch (utype) {
    case V_ASN1_OBJECT:
      otmp = (ASN1_OBJECT *)*pval;
      cont = otmp->data;
      len = otmp->length;
      if (len == 0) {
        // Some |ASN1_OBJECT|s do not have OIDs and cannot be serialized.
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OBJECT);
        return -1;
      }
      break;

    case V_ASN1_NULL:
      cont = NULL;
      len = 0;
      break;

    case V_ASN1_BOOLEAN:
      tbool = (ASN1_BOOLEAN *)pval;
      if (*tbool == ASN1_BOOLEAN_NONE) {
        *out_omit = 1;
        return 0;
      }
      if (it->utype != V_ASN1_ANY) {
        // Default handling if value == size field then omit
        if ((*tbool && (it->size > 0)) || (!*tbool && !it->size)) {
          *out_omit = 1;
          return 0;
        }
      }
      c = *tbool ? 0xff : 0x00;
      cont = &c;
      len = 1;
      break;

    case V_ASN1_BIT_STRING: {
      int ret =
          i2c_ASN1_BIT_STRING((ASN1_BIT_STRING *)*pval, cout ? &cout : NULL);
      // |i2c_ASN1_BIT_STRING| returns zero on error instead of -1.
      return ret <= 0 ? -1 : ret;
    }

    case V_ASN1_INTEGER:
    case V_ASN1_ENUMERATED: {
      // |i2c_ASN1_INTEGER| also handles ENUMERATED.
      int ret = i2c_ASN1_INTEGER((ASN1_INTEGER *)*pval, cout ? &cout : NULL);
      // |i2c_ASN1_INTEGER| returns zero on error instead of -1.
      return ret <= 0 ? -1 : ret;
    }

    case V_ASN1_OCTET_STRING:
    case V_ASN1_NUMERICSTRING:
    case V_ASN1_PRINTABLESTRING:
    case V_ASN1_T61STRING:
    case V_ASN1_VIDEOTEXSTRING:
    case V_ASN1_IA5STRING:
    case V_ASN1_UTCTIME:
    case V_ASN1_GENERALIZEDTIME:
    case V_ASN1_GRAPHICSTRING:
    case V_ASN1_VISIBLESTRING:
    case V_ASN1_GENERALSTRING:
    case V_ASN1_UNIVERSALSTRING:
    case V_ASN1_BMPSTRING:
    case V_ASN1_UTF8STRING:
    case V_ASN1_SEQUENCE:
    case V_ASN1_SET:
    // This is not a valid |ASN1_ITEM| type, but it appears in |ASN1_TYPE|.
    case V_ASN1_OTHER:
      // All based on ASN1_STRING and handled the same
      strtmp = (ASN1_STRING *)*pval;
      cont = strtmp->data;
      len = strtmp->length;
      break;

    default:
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      return -1;
  }
  if (cout && len) {
    OPENSSL_memcpy(cout, cont, len);
  }
  return len;
}